

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O3

void __thiscall
expression_tree::detail::
default_branch<float,_expression_tree::no_caching,_expression_tree::sequential>::default_branch
          (default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this,
          operation<float> *f,node_t *l,node_t *r)

{
  unique_ptr<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
  *puVar1;
  node_impl<float> *pnVar2;
  pointer *__ptr_1;
  pointer *__ptr;
  
  (this->super_node_impl<float>)._vptr_node_impl = (_func_int **)&PTR__default_branch_0011fce0;
  (this->l)._vptr_node = (_func_int **)&PTR__node_0011f140;
  puVar1 = &(this->l).impl;
  pnVar2 = (l->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>._M_head_impl;
  if (pnVar2 == (node_impl<float> *)0x0) {
    (puVar1->_M_t).
    super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
    .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>._M_head_impl =
         (node_impl<float> *)0x0;
  }
  else {
    (*pnVar2->_vptr_node_impl[2])(puVar1);
  }
  (this->l).parent = l->parent;
  (this->r)._vptr_node = (_func_int **)&PTR__node_0011f140;
  puVar1 = &(this->r).impl;
  pnVar2 = (r->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>._M_head_impl;
  if (pnVar2 == (node_impl<float> *)0x0) {
    (puVar1->_M_t).
    super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
    .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>._M_head_impl =
         (node_impl<float> *)0x0;
  }
  else {
    (*pnVar2->_vptr_node_impl[2])(puVar1);
  }
  (this->r).parent = r->parent;
  std::function<float_(const_float_&,_const_float_&)>::function(&this->f,f);
  this->constant_ = indeterminate;
  return;
}

Assistant:

default_branch(const operation<T>& f, const node_t& l, const node_t& r) : l(l), r(r), f(f), constant_(indeterminate) {}